

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

int Symbol_insert(symbol *data,char *key)

{
  uint uVar1;
  s_x2node *psVar2;
  s_x2node **ppsVar3;
  size_t __nmemb;
  s_x2 *psVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  s_x2node *psVar8;
  char *pcVar9;
  ulong uVar10;
  uint uVar11;
  symbol *psVar12;
  uint uVar13;
  symbol *psVar14;
  char *pcVar15;
  s_x2node *psVar16;
  
  psVar4 = x2a;
  if (x2a == (s_x2 *)0x0) {
LAB_0010c3c0:
    iVar7 = 0;
  }
  else {
    cVar5 = *key;
    if (cVar5 == '\0') {
      uVar11 = 0;
    }
    else {
      pcVar9 = key + 1;
      uVar11 = 0;
      do {
        uVar11 = (int)cVar5 + uVar11 * 0xd;
        cVar5 = *pcVar9;
        pcVar9 = pcVar9 + 1;
      } while (cVar5 != '\0');
    }
    iVar7 = x2a->size;
    for (psVar8 = x2a->ht[iVar7 - 1U & uVar11]; psVar8 != (s_x2node *)0x0; psVar8 = psVar8->next) {
      iVar6 = strcmp(psVar8->key,key);
      if (iVar6 == 0) goto LAB_0010c3c0;
    }
    uVar1 = psVar4->count;
    if (iVar7 <= (int)uVar1) {
      __nmemb = (long)iVar7 * 2;
      psVar8 = (s_x2node *)calloc(__nmemb,0x28);
      if (psVar8 == (s_x2node *)0x0) goto LAB_0010c3c0;
      psVar16 = psVar8 + (long)iVar7 * 2;
      iVar6 = (int)__nmemb;
      if (0 < iVar7) {
        uVar10 = 1;
        if (1 < iVar6) {
          uVar10 = __nmemb & 0xffffffff;
        }
        memset(psVar16,0,uVar10 << 3);
      }
      if (0 < (int)uVar1) {
        uVar10 = 0;
        do {
          psVar2 = psVar4->tbl;
          pcVar9 = psVar2[uVar10].key;
          cVar5 = *pcVar9;
          uVar13 = 0;
          if (cVar5 != '\0') {
            uVar13 = 0;
            pcVar15 = pcVar9;
            do {
              pcVar15 = pcVar15 + 1;
              uVar13 = (int)cVar5 + uVar13 * 0xd;
              cVar5 = *pcVar15;
            } while (cVar5 != '\0');
          }
          uVar13 = uVar13 & iVar6 - 1U;
          psVar14 = (symbol *)(psVar8 + uVar10);
          if ((&psVar16->data)[uVar13] != (symbol *)0x0) {
            (&psVar16->data)[uVar13]->fallback = (symbol *)&psVar14->rule;
          }
          psVar12 = (symbol *)(&psVar16->data + uVar13);
          psVar14->rule = (rule *)psVar12->name;
          *(char **)&psVar14->index = pcVar9;
          psVar14->name = (char *)psVar2[uVar10].data;
          psVar14->fallback = psVar12;
          psVar12->name = (char *)psVar14;
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar1);
      }
      free(psVar4->tbl);
      psVar4->size = iVar6;
      psVar4->count = uVar1;
      psVar4->tbl = psVar8;
      psVar4->ht = (s_x2node **)psVar16;
    }
    uVar11 = psVar4->size - 1U & uVar11;
    psVar16 = psVar4->tbl;
    iVar7 = psVar4->count;
    psVar4->count = iVar7 + 1;
    psVar8 = psVar16 + iVar7;
    psVar16[iVar7].key = key;
    psVar16[iVar7].data = data;
    ppsVar3 = psVar4->ht;
    if (ppsVar3[uVar11] != (s_x2node *)0x0) {
      ppsVar3[uVar11]->from = &psVar8->next;
    }
    psVar8->next = ppsVar3[uVar11];
    ppsVar3[uVar11] = psVar8;
    psVar8->from = psVar4->ht + uVar11;
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

int Symbol_insert(struct symbol *data, const char *key)
{
  x2node *np;
  unsigned h;
  unsigned ph;

  if( x2a==0 ) return 0;
  ph = strhash(key);
  h = ph & (x2a->size-1);
  np = x2a->ht[h];
  while( np ){
    if( strcmp(np->key,key)==0 ){
      /* An existing entry with the same key is found. */
      /* Fail because overwrite is not allows. */
      return 0;
    }
    np = np->next;
  }
  if( x2a->count>=x2a->size ){
    /* Need to make the hash table bigger */
    int i,size;
    struct s_x2 array;
    array.size = size = x2a->size*2;
    array.count = x2a->count;
    array.tbl = (x2node*)calloc(size, sizeof(x2node) + sizeof(x2node*));
    if( array.tbl==0 ) return 0;  /* Fail due to malloc failure */
    array.ht = (x2node**)&(array.tbl[size]);
    for(i=0; i<size; i++) array.ht[i] = 0;
    for(i=0; i<x2a->count; i++){
      x2node *oldnp, *newnp;
      oldnp = &(x2a->tbl[i]);
      h = strhash(oldnp->key) & (size-1);
      newnp = &(array.tbl[i]);
      if( array.ht[h] ) array.ht[h]->from = &(newnp->next);
      newnp->next = array.ht[h];
      newnp->key = oldnp->key;
      newnp->data = oldnp->data;
      newnp->from = &(array.ht[h]);
      array.ht[h] = newnp;
    }
    free(x2a->tbl);
    *x2a = array;
  }
  /* Insert the new data */
  h = ph & (x2a->size-1);
  np = &(x2a->tbl[x2a->count++]);
  np->key = key;
  np->data = data;
  if( x2a->ht[h] ) x2a->ht[h]->from = &(np->next);
  np->next = x2a->ht[h];
  x2a->ht[h] = np;
  np->from = &(x2a->ht[h]);
  return 1;
}